

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

int __thiscall CVmImagePool::init(CVmImagePool *this,EVP_PKEY_CTX *ctx)

{
  size_t sVar1;
  CVmImagePool_pg **ppCVar2;
  CVmImagePool_pg *pCVar3;
  ulong in_RCX;
  ulong in_RDX;
  size_t i;
  size_t cnt;
  ulong local_30;
  
  this->page_count_ = in_RDX;
  this->page_size_ = in_RCX;
  this->fp_ = (CVmImageFile *)ctx;
  if (this->page_info_ != (CVmImagePool_pg **)0x0) {
    err_throw(0);
  }
  sVar1 = get_subarray_count(this);
  ppCVar2 = (CVmImagePool_pg **)malloc(sVar1 << 3);
  this->page_info_ = ppCVar2;
  if (this->page_info_ == (CVmImagePool_pg **)0x0) {
    err_throw(0);
  }
  memset(this->page_info_,0,sVar1 << 3);
  local_30 = 0;
  while( true ) {
    if (sVar1 <= local_30) {
      return (int)local_30;
    }
    pCVar3 = (CVmImagePool_pg *)malloc(0x18000);
    this->page_info_[local_30] = pCVar3;
    if (this->page_info_[local_30] == (CVmImagePool_pg *)0x0) break;
    memset(this->page_info_[local_30],0,0x18000);
    local_30 = local_30 + 1;
  }
  err_throw(0);
}

Assistant:

void CVmImagePool::init(CVmImageFile *fp, ulong page_count, ulong page_size)
{
    size_t cnt;
    size_t i;

    /* remember the page count and page size */
    page_count_ = page_count;
    page_size_ = page_size;

    /* remember the underlying image file */
    fp_ = fp;

    /* if this pool has already been defined, throw an error */
    if (page_info_ != 0)
        err_throw(VMERR_IMAGE_POOL_REDEF);
    
    /* 
     *   Allocate the main page array.  We need one entry for each
     *   subarray, so figure the subarray count and allocate the
     *   appropriate amount of space.  
     */
    cnt = get_subarray_count();
    page_info_ = (CVmImagePool_pg **)t3malloc(cnt * sizeof(page_info_[0]));

    /* throw an error if that failed */
    if (page_info_ == 0)
        err_throw(VMERR_OUT_OF_MEMORY);

    /* clear the array */
    memset(page_info_, 0, cnt * sizeof(page_info_[0]));

    /* allocate the subarrays */
    for (i = 0 ; i < cnt ; ++i)
    {
        /* allocate this page, which contains file offsets */
        page_info_[i] =
            (CVmImagePool_pg *)t3malloc(VMIMAGE_POOL_SUBARRAY_SIZE
                                        * sizeof(page_info_[i][0]));

        /* throw an error if that failed */
        if (page_info_[i] == 0)
            err_throw(VMERR_OUT_OF_MEMORY);

        /* clear the memory */
        memset(page_info_[i], 0,
               VMIMAGE_POOL_SUBARRAY_SIZE * sizeof(page_info_[i][0]));
    }
}